

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_ResolveModule(JSContext *ctx,JSValue obj)

{
  int iVar1;
  JSContext *in_RDX;
  undefined8 in_RSI;
  JSModuleDef *m;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((int)in_RDX == -3) &&
     (iVar1 = js_resolve_module((JSContext *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                (JSModuleDef *)in_RDX), iVar1 < 0)) {
    js_free_modules(in_RDX,(JSFreeModuleEnum)((ulong)in_RSI >> 0x20));
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int JS_ResolveModule(JSContext *ctx, JSValueConst obj)
{
    if (JS_VALUE_GET_TAG(obj) == JS_TAG_MODULE) {
        JSModuleDef *m = JS_VALUE_GET_PTR(obj);
        // printf("%s\n",JS_AtomToCString(ctx,m->module_name));
        if (js_resolve_module(ctx, m) < 0) {
            js_free_modules(ctx, JS_FREE_MODULE_NOT_RESOLVED);
            return -1;
        }
    }
    return 0;
}